

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_GetSetRGB_Test::TestBody(Image_GetSetRGB_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_01;
  Point2i p;
  WrapMode2D wrapMode;
  Point2i p_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  Point2i p_01;
  Point2i resolution;
  WrapMode2D wrapMode_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int *piVar4;
  reference val1;
  reference val2;
  reference pvVar5;
  char *pcVar6;
  int iVar7;
  AssertionResult gtest_ar_6;
  Float qv;
  AssertionResult gtest_ar_5;
  int offset;
  AssertionResult gtest_ar_4;
  int c_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  ImageChannelValues rgb2;
  AssertionResult gtest_ar;
  ImageChannelValues rgb;
  int x_1;
  int y_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ImageChannelDesc rgbDesc;
  int c;
  int x;
  int y;
  Image image;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  ColorEncodingHandle *in_stack_fffffffffffff728;
  Image *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff738;
  WrapMode in_stack_fffffffffffff73c;
  WrapMode2D *in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  Float in_stack_fffffffffffff74c;
  reference in_stack_fffffffffffff750;
  char *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  float in_stack_fffffffffffff764;
  float in_stack_fffffffffffff768;
  value_type_conflict1 in_stack_fffffffffffff76c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  char *in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  Float in_stack_fffffffffffff7a0;
  int in_stack_fffffffffffff7a4;
  Image *in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7b0;
  WrapMode in_stack_fffffffffffff7b4;
  WrapMode in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  int iVar8;
  int in_stack_fffffffffffff7c4;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff7c8;
  char *in_stack_fffffffffffff7f0;
  undefined7 in_stack_fffffffffffff7f8;
  Image *in_stack_fffffffffffff808;
  char *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffff820;
  int in_stack_fffffffffffff828;
  ColorEncodingHandle *in_stack_fffffffffffff840;
  PixelFormat in_stack_fffffffffffff84c;
  Image *in_stack_fffffffffffff850;
  Allocator in_stack_fffffffffffff858;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  string *desc;
  Image *this_00;
  undefined7 in_stack_fffffffffffff890;
  Tuple2<pbrt::Point2,_int> p_02;
  string *local_6f8;
  string *local_650;
  AssertionResult local_600;
  Float local_5ec;
  undefined4 local_5d8;
  float local_5d4;
  AssertionResult local_5d0;
  int local_5bc;
  Float local_594;
  AssertionResult local_590;
  int local_57c;
  AssertionResult local_568 [2];
  AssertionResult local_548 [2];
  AssertionResult local_528 [6];
  WrapMode local_4c8 [2];
  undefined4 local_4bc;
  AssertionResult local_4b8 [2];
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_498;
  int local_468;
  int local_464;
  string local_460 [52];
  undefined1 local_42c;
  allocator<char> local_42b;
  allocator<char> local_42a;
  allocator<char> local_429;
  Tuple2<pbrt::Point2,_int> local_428;
  ImageChannelDesc local_420;
  undefined1 local_3e0 [32];
  ImageChannelDesc *local_3c0;
  undefined8 local_3b8;
  AssertionResult local_370;
  string local_360 [48];
  AssertionResult local_330;
  undefined1 local_31c;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319;
  string *local_318;
  string local_310 [32];
  undefined1 local_2f0 [32];
  undefined1 local_2d0 [32];
  string *local_2b0;
  undefined8 local_2a8;
  int local_254;
  int local_250;
  int local_24c;
  ColorEncodingHandle *local_248;
  undefined1 local_237;
  allocator<char> local_236;
  allocator<char> local_235 [20];
  allocator<char> local_221;
  string *local_220;
  string local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  string *local_1b8;
  undefined8 local_1b0;
  Tuple2<pbrt::Point2,_int> local_198;
  PixelFormat local_74;
  const_iterator local_70;
  const_iterator local_68;
  PixelFormat local_5c [3];
  initializer_list<pbrt::PixelFormat> local_50;
  initializer_list<pbrt::PixelFormat> *local_40;
  Tuple2<pbrt::Point2,_int> local_38;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_30;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff730,
             (int)((ulong)in_stack_fffffffffffff728 >> 0x20),(int)in_stack_fffffffffffff728);
  local_38 = local_10[0];
  GetFloatPixels((Point2i)in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c4);
  local_5c[0] = U256;
  local_5c[1] = 1;
  local_5c[2] = 2;
  local_50._M_array = local_5c;
  local_50._M_len = 3;
  local_40 = &local_50;
  local_68 = std::initializer_list<pbrt::PixelFormat>::begin(local_40);
  local_70 = std::initializer_list<pbrt::PixelFormat>::end
                       ((initializer_list<pbrt::PixelFormat> *)in_stack_fffffffffffff730);
  for (; local_68 != local_70; local_68 = local_68 + 1) {
    local_74 = *local_68;
    local_198 = local_10[0];
    local_237 = 1;
    local_220 = local_218;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_220 = (string *)local_1f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_220 = (string *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_237 = 0;
    local_1b8 = local_218;
    local_1b0 = 3;
    v._M_array._4_4_ = in_stack_fffffffffffff73c;
    v._M_array._0_4_ = in_stack_fffffffffffff738;
    v._M_len = (size_type)in_stack_fffffffffffff740;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff730,v);
    pbrt::ColorEncodingHandle::ColorEncodingHandle
              ((ColorEncodingHandle *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff730);
    resolution.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffff877;
    resolution.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffff870;
    in_stack_fffffffffffff728 = local_248;
    pbrt::Image::Image(in_stack_fffffffffffff850,in_stack_fffffffffffff84c,resolution,
                       in_stack_fffffffffffff860,in_stack_fffffffffffff840,in_stack_fffffffffffff858
                      );
    local_650 = (string *)&local_1b8;
    do {
      local_650 = local_650 + -0x20;
      std::__cxx11::string::~string(local_650);
    } while (local_650 != local_218);
    std::allocator<char>::~allocator(&local_236);
    std::allocator<char>::~allocator(local_235);
    std::allocator<char>::~allocator(&local_221);
    for (local_24c = 0; iVar8 = local_24c,
        piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1), iVar8 < *piVar4;
        local_24c = local_24c + 1) {
      for (local_250 = 0; iVar8 = local_250,
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0), iVar8 < *piVar4;
          local_250 = local_250 + 1) {
        for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff730,
                     (int)((ulong)in_stack_fffffffffffff728 >> 0x20),(int)in_stack_fffffffffffff728)
          ;
          iVar8 = local_24c * 3;
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                    (&local_30,(long)(iVar8 * *piVar4 + local_250 * 3 + local_254));
          p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff7b4;
          p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff7b0;
          pbrt::Image::SetChannel
                    (in_stack_fffffffffffff7a8,p,in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0
                    );
        }
      }
    }
    local_31c = 1;
    local_318 = local_310;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_318 = (string *)local_2f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_318 = (string *)local_2d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_31c = 0;
    local_2b0 = local_310;
    local_2a8 = 3;
    v_00._M_array._4_4_ = in_stack_fffffffffffff73c;
    v_00._M_array._0_4_ = in_stack_fffffffffffff738;
    v_00._M_len = (size_type)in_stack_fffffffffffff740;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff730,v_00);
    requestedChannels.n._0_7_ = in_stack_fffffffffffff818;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_stack_fffffffffffff810;
    requestedChannels.n._7_1_ = in_stack_fffffffffffff81f;
    pbrt::Image::GetChannelDesc(in_stack_fffffffffffff808,requestedChannels);
    local_6f8 = (string *)&local_2b0;
    do {
      local_6f8 = local_6f8 + -0x20;
      std::__cxx11::string::~string(local_6f8);
    } while (local_6f8 != local_310);
    std::allocator<char>::~allocator(&local_31b);
    std::allocator<char>::~allocator(&local_31a);
    std::allocator<char>::~allocator(&local_319);
    pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5bdb53);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffff730,
               SUB81((ulong)in_stack_fffffffffffff728 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffff7a8,
                 (char *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 (char *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                 in_stack_fffffffffffff790);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),(char *)in_stack_fffffffffffff750,
                 (int)in_stack_fffffffffffff74c,(char *)in_stack_fffffffffffff740);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (Message *)in_stack_fffffffffffff7a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
      std::__cxx11::string::~string(local_360);
      testing::Message::~Message((Message *)0x5bddbb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bde36);
    local_42c = 1;
    local_428 = (Tuple2<pbrt::Point2,_int>)&local_420;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_428 = (Tuple2<pbrt::Point2,_int>)&local_420.offset.nAlloc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    p_02 = (Tuple2<pbrt::Point2,_int>)local_3e0;
    local_428 = p_02;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff770,
               (char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    local_42c = 0;
    local_3c0 = &local_420;
    local_3b8 = 3;
    v_01._M_array._4_4_ = in_stack_fffffffffffff73c;
    v_01._M_array._0_4_ = in_stack_fffffffffffff738;
    v_01._M_len = (size_type)in_stack_fffffffffffff740;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff730,v_01);
    requestedChannels_00.n._0_7_ = in_stack_fffffffffffff818;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         in_stack_fffffffffffff810;
    requestedChannels_00.n._7_1_ = in_stack_fffffffffffff81f;
    pbrt::Image::GetChannelDesc(in_stack_fffffffffffff808,requestedChannels_00);
    uVar2 = pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x5bdf96);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffff730,
               SUB81((ulong)in_stack_fffffffffffff728 >> 0x38,0));
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5bdfca);
    desc = (string *)&local_420;
    this_00 = (Image *)(local_3e0 + 0x20);
    do {
      this_00 = (Image *)((long)this_00 + -0x20);
      std::__cxx11::string::~string((string *)this_00);
    } while (this_00 != (Image *)desc);
    std::allocator<char>::~allocator(&local_42b);
    std::allocator<char>::~allocator(&local_42a);
    std::allocator<char>::~allocator(&local_429);
    in_stack_fffffffffffff877 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!(bool)in_stack_fffffffffffff877) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)in_stack_fffffffffffff7a8,
                 (char *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                 (char *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                 in_stack_fffffffffffff790);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),(char *)in_stack_fffffffffffff750,
                 (int)in_stack_fffffffffffff74c,(char *)in_stack_fffffffffffff740);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (Message *)in_stack_fffffffffffff7a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
      std::__cxx11::string::~string(local_460);
      testing::Message::~Message((Message *)0x5be2a5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5be320);
    for (local_464 = 0; iVar8 = local_464,
        in_stack_fffffffffffff840 =
             (ColorEncodingHandle *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1),
        iVar8 < (int)(in_stack_fffffffffffff840->
                     super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                     ).bits; local_464 = local_464 + 1) {
      local_468 = 0;
      while (iVar8 = local_468, piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0),
            iVar8 < *piVar4) {
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff730,
                   (int)((ulong)in_stack_fffffffffffff728 >> 0x20),(int)in_stack_fffffffffffff728);
        pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
        p_01.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
        p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff828;
        pbrt::Image::GetChannels
                  ((Image *)CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818),p_01,
                   (WrapMode2D)in_stack_fffffffffffff820.values);
        local_4bc = 3;
        in_stack_fffffffffffff820.values =
             (WrapMode  [2])
             pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size
                       (&local_498);
        local_4c8 = in_stack_fffffffffffff820.values;
        testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                  ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                   (char *)in_stack_fffffffffffff740,
                   (int *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                   (unsigned_long *)in_stack_fffffffffffff730);
        in_stack_fffffffffffff81f = testing::AssertionResult::operator_cast_to_bool(local_4b8);
        if (!(bool)in_stack_fffffffffffff81f) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
          in_stack_fffffffffffff810 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5be4f4);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                     (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                     (char *)in_stack_fffffffffffff740);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (Message *)in_stack_fffffffffffff7a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
          testing::Message::~Message((Message *)0x5be557);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5be5af);
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffff730,
                   (int)((ulong)in_stack_fffffffffffff728 >> 0x20),(int)in_stack_fffffffffffff728);
        pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
        wrapMode_00.wrap.values[1]._3_1_ = uVar2;
        wrapMode_00.wrap.values._0_7_ = in_stack_fffffffffffff890;
        pbrt::Image::GetChannels(this_00,(Point2i)p_02,(ImageChannelDesc *)desc,wrapMode_00);
        in_stack_fffffffffffff808 =
             (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  *)in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                   in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                   (char *)in_stack_fffffffffffff740,
                   (float *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                   (float *)in_stack_fffffffffffff730);
        uVar3 = testing::AssertionResult::operator_cast_to_bool(local_528);
        if (!(bool)uVar3) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
          in_stack_fffffffffffff7f0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x5be6fa);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                     (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                     (char *)in_stack_fffffffffffff740);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (Message *)in_stack_fffffffffffff7a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
          testing::Message::~Message((Message *)0x5be75d);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5be7b5);
        val1 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        val2 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                          in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                   (char *)in_stack_fffffffffffff740,
                   (float *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                   (float *)in_stack_fffffffffffff730);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_548);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
          testing::AssertionResult::failure_message((AssertionResult *)0x5be889);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                     (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                     (char *)in_stack_fffffffffffff740);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (Message *)in_stack_fffffffffffff7a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
          testing::Message::~Message((Message *)0x5be8ec);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5be944);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                   in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        pvVar5 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
        iVar8 = (int)pvVar5;
        testing::internal::EqHelper<false>::Compare<float,float>
                  ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                   (char *)in_stack_fffffffffffff740,
                   (float *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                   (float *)in_stack_fffffffffffff730);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_568);
        in_stack_fffffffffffff7bc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7bc);
        if (!bVar1) {
          testing::Message::Message
                    ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x5bea18);
          in_stack_fffffffffffff7b0 = (int)pcVar6;
          in_stack_fffffffffffff7b4 = (WrapMode)((ulong)pcVar6 >> 0x20);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                     (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                     (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                     (char *)in_stack_fffffffffffff740);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                     (Message *)in_stack_fffffffffffff7a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff730);
          testing::Message::~Message((Message *)0x5bea7b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bead3);
        for (local_57c = 0; local_57c < 3; local_57c = local_57c + 1) {
          in_stack_fffffffffffff7a8 =
               (Image *)pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                        operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                    *)in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728
                                  );
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff730,
                     (int)((ulong)in_stack_fffffffffffff728 >> 0x20),(int)in_stack_fffffffffffff728)
          ;
          in_stack_fffffffffffff7a4 = local_57c;
          pbrt::WrapMode2D::WrapMode2D(in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffff7bc;
          wrapMode.wrap.values[1] = in_stack_fffffffffffff7b8;
          wrapMode.wrap.values[0] = in_stack_fffffffffffff7b4;
          in_stack_fffffffffffff7a0 =
               pbrt::Image::GetChannel
                         (in_stack_fffffffffffff7a8,p_00,in_stack_fffffffffffff7a4,wrapMode);
          local_594 = in_stack_fffffffffffff7a0;
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                     (char *)in_stack_fffffffffffff740,
                     (float *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                     (float *)in_stack_fffffffffffff730);
          in_stack_fffffffffffff79f = testing::AssertionResult::operator_cast_to_bool(&local_590);
          if (!(bool)in_stack_fffffffffffff79f) {
            testing::Message::Message
                      ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
            in_stack_fffffffffffff790 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x5bec15);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760)
                       ,(Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                       (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                       (char *)in_stack_fffffffffffff740);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0)
                       ,(Message *)in_stack_fffffffffffff7a8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffff730);
            testing::Message::~Message((Message *)0x5bec72);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5becca);
          iVar7 = local_464 * 3;
          piVar4 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          local_5bc = iVar7 * *piVar4 + local_468 * 3 + local_57c;
          if (local_74 == U256) {
            pvVar5 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                     operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
            in_stack_fffffffffffff76c = *pvVar5;
            in_stack_fffffffffffff770 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_30,(long)local_5bc);
            iVar7 = 0;
            in_stack_fffffffffffff768 =
                 pbrt::Clamp<float,int,int>(*(float *)in_stack_fffffffffffff770,0,1);
            in_stack_fffffffffffff764 = in_stack_fffffffffffff76c - in_stack_fffffffffffff768;
            std::abs(iVar7);
            local_5d8 = 0x3b00c24b;
            local_5d4 = in_stack_fffffffffffff764;
            testing::internal::CmpHelperLT<float,float>
                      ((char *)CONCAT17(uVar3,in_stack_fffffffffffff7f8),in_stack_fffffffffffff7f0,
                       val1,val2);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d0);
            in_stack_fffffffffffff760 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff760);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
              in_stack_fffffffffffff758 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x5bee53);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                         (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                         (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                         (char *)in_stack_fffffffffffff740);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                         (Message *)in_stack_fffffffffffff7a8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff730);
              testing::Message::~Message((Message *)0x5beeb0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bef05);
          }
          else {
            in_stack_fffffffffffff750 =
                 pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (&local_30,(long)local_5bc);
            in_stack_fffffffffffff74c =
                 modelQuantization(SUB84(in_stack_fffffffffffff730,0),
                                   (PixelFormat)((ulong)in_stack_fffffffffffff728 >> 0x20));
            local_5ec = in_stack_fffffffffffff74c;
            in_stack_fffffffffffff740 =
                 (WrapMode2D *)
                 pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffff730,(size_type)in_stack_fffffffffffff728);
            testing::internal::EqHelper<false>::Compare<float,float>
                      ((char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                       (char *)in_stack_fffffffffffff740,
                       (float *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                       (float *)in_stack_fffffffffffff730);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_600);
            in_stack_fffffffffffff73c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff73c);
            if (!bVar1) {
              testing::Message::Message
                        ((Message *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
              in_stack_fffffffffffff730 =
                   (Image *)testing::AssertionResult::failure_message((AssertionResult *)0x5bf001);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                         (Type)((ulong)in_stack_fffffffffffff758 >> 0x20),
                         (char *)in_stack_fffffffffffff750,(int)in_stack_fffffffffffff74c,
                         (char *)in_stack_fffffffffffff740);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                         (Message *)in_stack_fffffffffffff7a8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffff730);
              testing::Message::~Message((Message *)0x5bf05e);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x5bf0b3);
          }
        }
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5bf0e9);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x5bf0f6);
        local_468 = local_468 + 1;
      }
    }
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x5bf14d);
    pbrt::Image::~Image(in_stack_fffffffffffff730);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff730);
  return;
}

Assistant:

TEST(Image, GetSetRGB) {
    Point2i res(7, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x)
                for (int c = 0; c < 3; ++c)
                    image.SetChannel({x, y}, c, rgbPixels[3 * y * res[0] + 3 * x + c]);

        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        EXPECT_TRUE(bool(rgbDesc));
        EXPECT_FALSE(bool(image.GetChannelDesc({"R", "Gxxx", "B"})));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues rgb = image.GetChannels({x, y});
                EXPECT_EQ(3, rgb.size());

                ImageChannelValues rgb2 = image.GetChannels({x, y}, rgbDesc);
                EXPECT_EQ(rgb[0], rgb2[0]);
                EXPECT_EQ(rgb[1], rgb2[1]);
                EXPECT_EQ(rgb[2], rgb2[2]);

                for (int c = 0; c < 3; ++c) {
                    EXPECT_EQ(rgb[c], image.GetChannel({x, y}, c));
                    int offset = 3 * y * res[0] + 3 * x + c;
                    if (format == PixelFormat::U256)
                        EXPECT_LT(std::abs(rgb[c] - Clamp(rgbPixels[offset], 0, 1)),
                                  0.501f / 255.f);
                    else {
                        Float qv = modelQuantization(rgbPixels[offset], format);
                        EXPECT_EQ(rgb[c], qv);
                    }
                }
            }
    }
}